

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

GLint __thiscall
VertexAttrib64Bit::LimitTest::calculateAttributeLocation
          (LimitTest *this,attributeConfiguration *configuration,GLint attribute,GLint n_type)

{
  GLint GVar1;
  long lVar2;
  
  GVar1 = 0;
  for (lVar2 = (long)(configuration->m_n_types + -1); n_type < (int)lVar2; lVar2 = lVar2 + -1) {
    GVar1 = GVar1 + (configuration->m_n_elements[lVar2] / configuration->m_n_rows[lVar2]) *
                    configuration->m_n_attributes_per_group;
  }
  if (attribute != -1) {
    GVar1 = GVar1 + (configuration->m_n_attributes_per_group + ~attribute) *
                    (configuration->m_n_elements[n_type] / configuration->m_n_rows[n_type]);
  }
  return GVar1;
}

Assistant:

GLint LimitTest::calculateAttributeLocation(const attributeConfiguration& configuration, GLint attribute,
											GLint n_type) const
{
	const GLint n_types = configuration.m_n_types;
	GLint		result  = 0;

	/* Amount of location required for types after given "n_type" */
	for (GLint i = n_types - 1; i > n_type; --i)
	{
		const GLint n_elements = configuration.m_n_elements[i];
		const GLint n_rows	 = configuration.m_n_rows[i];
		const GLint n_columns  = n_elements / n_rows;

		result += n_columns * configuration.m_n_attributes_per_group;
	}

	/* Amount of locations required for attributes after given attribute in given "n_type" */
	/* Arrayed attributes does not have any attributes after */
	if (m_array_attribute != attribute)
	{
		const GLint n_elements = configuration.m_n_elements[n_type];
		const GLint n_rows	 = configuration.m_n_rows[n_type];
		const GLint n_columns  = n_elements / n_rows;

		result += n_columns * (configuration.m_n_attributes_per_group - 1 - attribute);
	}

	/* Done */
	return result;
}